

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

void rtr_mgr_cb(rtr_socket *sock,rtr_socket_state state,void *data_config,void *data_group)

{
  pthread_rwlock_t *ppVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long *plVar7;
  rtr_mgr_status mgr_status;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  char *frmt;
  pthread_rwlock_t *ppVar11;
  pthread_rwlock_t *group;
  long in_FS_OFFSET;
  bool bVar12;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (state == RTR_SHUTDOWN) {
    lrtr_dbg("RTR_MGR: Received RTR_SHUTDOWN callback");
  }
  if (data_group == (void *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      frmt = "RTR_MGR: ERROR: Socket has no group";
LAB_001072a8:
      lrtr_dbg(frmt);
      return;
    }
    goto LAB_001075b6;
  }
  switch(state) {
  case RTR_CONNECTING:
    if (*(int *)((long)data_group + 0x10) != 3) {
LAB_0010742f:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        mgr_status = RTR_MGR_CONNECTING;
        break;
      }
      goto LAB_001075b6;
    }
LAB_0010739e:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_001075b6;
    mgr_status = RTR_MGR_ERROR;
    break;
  case RTR_ESTABLISHED:
    if (*(int *)((long)data_group + 0x10) == 3) {
      ppVar1 = (pthread_rwlock_t *)((long)data_config + 0x10);
      pthread_rwlock_rdlock(ppVar1);
      plVar7 = (long *)**data_config;
      if (plVar7 == (long *)0x0) {
        pthread_rwlock_unlock(ppVar1);
      }
      else {
        bVar9 = true;
        bVar12 = true;
        do {
          pvVar4 = *(void **)(plVar7[2] + 0x20);
          if ((((pvVar4 != data_group) && (*(int *)((long)pvVar4 + 0x10) != 0)) &&
              (*(int *)((long)pvVar4 + 0x10) != 3)) &&
             (bVar12 = bVar9, *(byte *)((long)pvVar4 + 0xc) < *(byte *)((long)data_group + 0xc))) {
            bVar9 = false;
            bVar12 = false;
          }
          plVar7 = (long *)*plVar7;
        } while (plVar7 != (long *)0x0);
        pthread_rwlock_unlock(ppVar1);
        if (!bVar12) goto LAB_0010739e;
      }
      uVar8 = (ulong)*(uint *)((long)data_group + 8);
      bVar12 = uVar8 == 0;
      if (!bVar12) {
        lVar3 = **data_group;
        if ((*(long *)(lVar3 + 0x10) == 0) || (*(int *)(lVar3 + 0x24) - 4U < 0xfffffffd))
        goto LAB_0010739e;
        uVar5 = 1;
        do {
          uVar10 = uVar5;
          if ((uVar8 == uVar10) || (lVar3 = (*data_group)[uVar10], *(long *)(lVar3 + 0x10) == 0))
          break;
          uVar5 = uVar10 + 1;
        } while (0xfffffffc < *(int *)(lVar3 + 0x24) - 4U);
        bVar12 = uVar8 <= uVar10;
      }
      if (!bVar12) goto LAB_0010739e;
    }
    else {
      if (*(int *)((long)data_group + 0x10) != 1) goto LAB_001072c8;
      uVar8 = (ulong)*(uint *)((long)data_group + 8);
      bVar12 = uVar8 == 0;
      if (!bVar12) {
        lVar3 = **data_group;
        if ((*(long *)(lVar3 + 0x10) == 0) || (*(int *)(lVar3 + 0x24) - 4U < 0xfffffffd))
        goto LAB_0010742f;
        uVar5 = 1;
        do {
          uVar10 = uVar5;
          if ((uVar8 == uVar10) || (lVar3 = (*data_group)[uVar10], *(long *)(lVar3 + 0x10) == 0))
          break;
          uVar5 = uVar10 + 1;
        } while (0xfffffffc < *(int *)(lVar3 + 0x24) - 4U);
        bVar12 = uVar8 <= uVar10;
      }
      if (!bVar12) goto LAB_0010742f;
    }
    set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,RTR_MGR_ESTABLISHED,sock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      rtr_mgr_close_less_preferable_groups
                (sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
      return;
    }
LAB_001075b6:
    __stack_chk_fail();
  default:
switchD_00107235_caseD_2:
    mgr_status = *(rtr_mgr_status *)((long)data_group + 0x10);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_001075b6;
    break;
  case RTR_ERROR_NO_DATA_AVAIL:
  case RTR_ERROR_FATAL:
  case RTR_ERROR_TRANSPORT:
    set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,RTR_MGR_ERROR,sock);
    ppVar1 = (pthread_rwlock_t *)((long)data_config + 0x10);
    pthread_rwlock_rdlock(ppVar1);
    for (puVar6 = (undefined8 *)**data_config; puVar6 != (undefined8 *)0x0;
        puVar6 = (undefined8 *)*puVar6) {
      if (*(int *)(*(long *)(puVar6[2] + 0x20) + 0x10) == 2) {
        pthread_rwlock_unlock(ppVar1);
        goto LAB_001072c3;
      }
    }
    pthread_rwlock_unlock(ppVar1);
LAB_001072c3:
    if (puVar6 == (undefined8 *)0x0) {
      ppVar11 = ppVar1;
      pthread_rwlock_rdlock(ppVar1);
      puVar6 = (undefined8 *)**data_config;
      do {
        if (puVar6 == (undefined8 *)0x0) {
          pthread_rwlock_unlock(ppVar1);
          group = (pthread_rwlock_t *)0x0;
          break;
        }
        group = *(pthread_rwlock_t **)(puVar6[2] + 0x20);
        if ((group == (pthread_rwlock_t *)data_group) || ((group->__data).__nr_readers_queued != 0))
        {
          puVar6 = (undefined8 *)*puVar6;
          bVar12 = true;
          group = ppVar11;
        }
        else {
          pthread_rwlock_unlock(ppVar1);
          bVar12 = false;
        }
        ppVar11 = group;
      } while (bVar12);
      if (group == (pthread_rwlock_t *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          frmt = "RTR_MGR: No other inactive groups found";
          goto LAB_001072a8;
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        rtr_mgr_start_sockets((rtr_mgr_group *)&group->__data);
        return;
      }
      goto LAB_001075b6;
    }
LAB_001072c8:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
    goto LAB_001075b6;
  case RTR_SHUTDOWN:
    if ((ulong)*(uint *)((long)data_group + 8) != 0) {
      uVar8 = 0;
      do {
        if (*(int *)(*(long *)(*data_group + uVar8 * 8) + 0x24) != 9) goto switchD_00107235_caseD_2;
        uVar8 = uVar8 + 1;
      } while (*(uint *)((long)data_group + 8) != uVar8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_001075b6;
    mgr_status = RTR_MGR_CLOSED;
  }
  set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,mgr_status,sock);
  return;
}

Assistant:

static void rtr_mgr_cb(const struct rtr_socket *sock, const enum rtr_socket_state state, void *data_config,
		       void *data_group)
{
	if (state == RTR_SHUTDOWN)
		MGR_DBG1("Received RTR_SHUTDOWN callback");

	struct rtr_mgr_config *config = data_config;
	struct rtr_mgr_group *group = data_group;

	if (!group) {
		MGR_DBG1("ERROR: Socket has no group");
		return;
	}

	switch (state) {
	case RTR_SHUTDOWN:
		_rtr_mgr_cb_state_shutdown(sock, config, group);
		break;
	case RTR_ESTABLISHED:
		_rtr_mgr_cb_state_established(sock, config, group);
		break;
	case RTR_CONNECTING:
		_rtr_mgr_cb_state_connecting(sock, config, group);
		break;
	case RTR_ERROR_FATAL:
	case RTR_ERROR_TRANSPORT:
	case RTR_ERROR_NO_DATA_AVAIL:
		_rtr_mgr_cb_state_error(sock, config, group);
		break;
	default:
		set_status(config, group, group->status, sock);
	}
}